

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall
backend::codegen::RegAllocator::replace_read
          (RegAllocator *this,Reg *r,int i,optional<unsigned_int> pre_alloc_transient)

{
  uint uVar1;
  pointer puVar2;
  Inst *pIVar3;
  short sVar4;
  int iVar5;
  bool bVar6;
  Reg RVar7;
  iterator iVar8;
  ostream *poVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  Tag *pTVar12;
  Function *pFVar13;
  Interval i_00;
  Interval i_01;
  char *tag;
  MemoryOperand *this_00;
  anon_class_8_2_9473111c disp_reg;
  allocator<char> local_12a;
  allocator<char> local_129;
  _Storage<unsigned_int,_true> local_128;
  allocator<char> local_121;
  undefined1 local_120 [32];
  string local_100;
  anon_class_8_2_9473111c local_dc;
  int local_d4;
  Tag local_d0;
  undefined **local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined1 local_88 [88];
  
  local_dc.r = *r;
  pTVar12 = (Tag *)(ulong)local_dc.r;
  local_dc.i = i;
  RVar7 = get_collapse_reg(this,local_dc.r);
  *r = RVar7;
  if (RVar7 < 0x40) {
    replace_read::anon_class_8_2_9473111c::operator()((anon_class_8_2_9473111c *)(local_120 + 0x44))
    ;
    local_128._M_value = local_128._M_value & 0xffffff00;
    AixLog::operator<<((ostream *)&local_128,(Severity *)pTVar12);
    AixLog::Tag::Tag(&local_d0);
    AixLog::operator<<((ostream *)&local_d0,pTVar12);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = &PTR__Timestamp_001d8f28;
    local_90 = 0;
    AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pTVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"replace_read",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_120 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_12a);
    pFVar13 = (Function *)local_120;
    AixLog::Function::Function
              ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x26f);
    AixLog::operator<<((ostream *)local_88,pFVar13);
    poVar9 = std::operator<<((ostream *)&std::clog,"phys");
    std::endl<char,std::char_traits<char>>(poVar9);
LAB_001603cc:
    AixLog::Function::~Function((Function *)local_88);
    std::__cxx11::string::~string((string *)(local_120 + 0x20));
    std::__cxx11::string::~string((string *)local_120);
    AixLog::Tag::~Tag(&local_d0);
    return;
  }
  pTVar12 = (Tag *)r;
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->reg_map)._M_h,r);
  if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    replace_read::anon_class_8_2_9473111c::operator()((anon_class_8_2_9473111c *)(local_120 + 0x44))
    ;
    local_128._M_value = local_128._M_value & 0xffffff00;
    AixLog::operator<<((ostream *)&local_128,(Severity *)pTVar12);
    AixLog::Tag::Tag(&local_d0);
    AixLog::operator<<((ostream *)&local_d0,pTVar12);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = &PTR__Timestamp_001d8f28;
    local_90 = 0;
    AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pTVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"replace_read",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_120 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_12a);
    pFVar13 = (Function *)local_120;
    AixLog::Function::Function
              ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x274);
    AixLog::operator<<((ostream *)local_88,pFVar13);
    poVar9 = std::operator<<((ostream *)&std::clog,"graph ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    AixLog::Function::~Function((Function *)local_88);
    std::__cxx11::string::~string((string *)(local_120 + 0x20));
    std::__cxx11::string::~string((string *)local_120);
    AixLog::Tag::~Tag(&local_d0);
    local_128 = *(_Storage<unsigned_int,_true> *)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0xc);
    goto LAB_001606dc;
  }
  iVar10 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->spilled_regs)._M_h,r);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
      _M_cur == (__node_type *)0x0) {
    pmVar11 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->live_intervals,r);
    i_01.start = pmVar11->start;
    i_01.end = pmVar11->end;
    RVar7 = alloc_transient_reg(this,i_01,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    *r = RVar7;
    replace_read::anon_class_8_2_9473111c::operator()((anon_class_8_2_9473111c *)(local_120 + 0x44))
    ;
    local_128._M_value = local_128._M_value & 0xffffff00;
    AixLog::operator<<((ostream *)&local_128,(Severity *)i_01);
    AixLog::Tag::Tag(&local_d0);
    AixLog::operator<<((ostream *)&local_d0,(Tag *)i_01);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = &PTR__Timestamp_001d8f28;
    local_90 = 0;
    AixLog::operator<<((ostream *)&local_a0,(Timestamp *)i_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"replace_read",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_120 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_12a);
    pFVar13 = (Function *)local_120;
    AixLog::Function::Function
              ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x2a3);
    AixLog::operator<<((ostream *)local_88,pFVar13);
    tag = "transient ";
    std::operator<<((ostream *)&std::clog,"transient ");
    AixLog::Function::~Function((Function *)local_88);
    std::__cxx11::string::~string((string *)(local_120 + 0x20));
    std::__cxx11::string::~string((string *)local_120);
    AixLog::Tag::~Tag(&local_d0);
    local_128._M_value = local_128._M_value & 0xffffff00;
    AixLog::operator<<((ostream *)&local_128,(Severity *)tag);
    AixLog::Tag::Tag(&local_d0);
    AixLog::operator<<((ostream *)&local_d0,(Tag *)tag);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = &PTR__Timestamp_001d8f28;
    local_90 = 0;
    AixLog::operator<<((ostream *)&local_a0,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"replace_read",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_120 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_12a);
    pFVar13 = (Function *)local_120;
    AixLog::Function::Function
              ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x2a4);
    AixLog::operator<<((ostream *)local_88,pFVar13);
    pTVar12 = (Tag *)(ulong)*r;
    arm::display_reg_name((ostream *)&std::clog,*r);
    AixLog::Function::~Function((Function *)local_88);
    std::__cxx11::string::~string((string *)(local_120 + 0x20));
    std::__cxx11::string::~string((string *)local_120);
    AixLog::Tag::~Tag(&local_d0);
    local_128._M_value = local_128._M_value & 0xffffff00;
    AixLog::operator<<((ostream *)&local_128,(Severity *)pTVar12);
    AixLog::Tag::Tag(&local_d0);
    AixLog::operator<<((ostream *)&local_d0,pTVar12);
    local_98 = std::chrono::_V2::system_clock::now();
    local_a0 = &PTR__Timestamp_001d8f28;
    local_90 = 0;
    AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pTVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"replace_read",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_120 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_12a);
    pFVar13 = (Function *)local_120;
    AixLog::Function::Function
              ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x2a5);
    AixLog::operator<<((ostream *)local_88,pFVar13);
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    goto LAB_001603cc;
  }
  local_d4 = get_or_alloc_spill_pos(this,*r);
  uVar1 = *(uint *)((long)iVar10.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                          ._M_cur + 0x10);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->spilled_regs)._M_h,r);
  if (((ulong)pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
    i_00.end = uVar1;
    i_00.start = i;
    RVar7 = alloc_transient_reg(this,i_00,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._4_4_ = 0;
    pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload._M_value = RVar7;
  }
  iVar5 = local_d4;
  local_128._M_value =
       pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  puVar2 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar4 = (short)local_d4;
  if ((puVar2 == (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) ||
     (pIVar3 = puVar2[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
     (pIVar3->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db9c0)) {
LAB_00160538:
    local_100._M_dataplus._M_p._0_4_ = 0x1a;
    local_88._16_2_ = (short)this->stack_offset + sVar4;
    local_88._0_8_ = &PTR_display_001db800;
    local_88[8] = None;
    local_88._12_4_ = 0xd;
    local_88[0x20] = '\x01';
    std::
    make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
              ((OpCode *)local_120,(uint *)(local_120 + 0x20),(MemoryOperand *)&local_128,local_88);
    local_d0._vptr_Tag = (_func_int **)local_120._0_8_;
    local_120._0_8_ = (LoadStoreInst *)0x0;
    pTVar12 = &local_d0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst_sink,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pTVar12
              );
    if ((LoadStoreInst *)local_d0._vptr_Tag != (LoadStoreInst *)0x0) {
      (*(((Inst *)local_d0._vptr_Tag)->super_Displayable)._vptr_Displayable[2])();
    }
    local_d0._vptr_Tag = (_func_int **)0x0;
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)local_120
              );
  }
  else {
    this_00 = (MemoryOperand *)0x0;
    if ((char)pIVar3[4].op == B) {
      this_00 = (MemoryOperand *)&pIVar3[1].op;
    }
    if ((pIVar3->op != StR) ||
       (*(uint *)&pIVar3[1].super_Displayable._vptr_Displayable != local_128._M_value))
    goto LAB_00160538;
    local_88._16_2_ = (short)this->stack_offset + sVar4;
    local_88._0_8_ = &PTR_display_001db800;
    local_88[8] = None;
    local_88._12_4_ = 0xd;
    local_88[0x20] = '\x01';
    bVar6 = arm::MemoryOperand::operator==(this_00,(MemoryOperand *)local_88);
    if ((!bVar6) ||
       ((puVar2[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond != this->cur_cond))
    goto LAB_00160538;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::pop_back(&this->inst_sink);
    local_88._0_8_ =
         (long)pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> << 0x20 | (ulong)*r;
    pTVar12 = (Tag *)local_88;
    local_88[8] = PreIndex;
    std::_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>::_M_move_assign
              ((_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *)
               &this->delayed_store,
               (_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *)pTVar12);
  }
  replace_read::anon_class_8_2_9473111c::operator()((anon_class_8_2_9473111c *)(local_120 + 0x44));
  local_129 = (allocator<char>)0x0;
  AixLog::operator<<((ostream *)&local_129,(Severity *)pTVar12);
  AixLog::Tag::Tag(&local_d0);
  AixLog::operator<<((ostream *)&local_d0,pTVar12);
  local_98 = std::chrono::_V2::system_clock::now();
  local_a0 = &PTR__Timestamp_001d8f28;
  local_90 = 0;
  AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pTVar12);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"replace_read",&local_12a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_120 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_121);
  pFVar13 = (Function *)local_120;
  AixLog::Function::Function
            ((Function *)local_88,(string *)pFVar13,(string *)(local_120 + 0x20),0x29b);
  AixLog::operator<<((ostream *)local_88,pFVar13);
  poVar9 = std::operator<<((ostream *)&std::clog,"spill ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
  poVar9 = std::operator<<(poVar9,"with rd=");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::endl<char,std::char_traits<char>>(poVar9);
  AixLog::Function::~Function((Function *)local_88);
  std::__cxx11::string::~string((string *)(local_120 + 0x20));
  std::__cxx11::string::~string((string *)local_120);
  AixLog::Tag::~Tag(&local_d0);
LAB_001606dc:
  *r = (Reg)local_128;
  return;
}

Assistant:

void RegAllocator::replace_read(Reg &r, int i,
                                std::optional<Reg> pre_alloc_transient) {
  auto disp_reg = [r, i]() {
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << " at: " << i << " ";
  };
  r = get_collapse_reg(r);
  if (!is_virtual_register(r)) {
    disp_reg();
    LOG(TRACE) << "phys" << std::endl;
    return;
  } else if (auto reg_map_r = reg_map.find(r); reg_map_r != reg_map.end()) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph " << reg_map_r->second << std::endl;
    r = reg_map_r->second;
    return;
  } else if (auto spill_r = spilled_regs.find(r);
             spill_r != spilled_regs.end()) {
    // this register is allocated in stack
    bool del = false;

    Reg rd;
    auto spill_pos = get_or_alloc_spill_pos(r);
    auto interval = spill_r->second;
    interval.start = i;
    spilled_regs.erase(r);
    if (pre_alloc_transient) {
      rd = pre_alloc_transient.value();
    } else {
      rd = alloc_transient_reg(interval, r);
    }

    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x_->rd == rd &&
            (*x__) == MemoryOperand(REG_SP, spill_pos + stack_offset) &&
            x->cond == cur_cond) {
          del = true;
        }
      }
    }
    if (del) {
      inst_sink.pop_back();
      delayed_store = {{r, rd}};
    } else {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::LdR, rd, MemoryOperand(REG_SP, spill_pos + stack_offset),
          cur_cond));
    }
    disp_reg();
    LOG(TRACE) << "spill " << spill_pos << "with rd=" << rd << std::endl;
    r = rd;
    return;
  } else {
    // is temporary register
    auto live_interval = live_intervals.at(r);
    r = alloc_transient_reg(live_interval, r);
    disp_reg();
    LOG(TRACE) << "transient ";
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << std::endl;
    return;
  }
}